

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

Aggregate * __thiscall
hta::Metric::aggregate(Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  Aggregate other;
  Aggregate other_00;
  Aggregate other_01;
  Aggregate other_02;
  Aggregate other_03;
  bool bVar1;
  time_point *ptVar2;
  Aggregate local_248;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_218;
  duration local_210;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_208;
  Aggregate local_200;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1d0;
  Metric *local_1c8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1c0;
  Aggregate local_1b8;
  rep local_188;
  Metric *local_180;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_178;
  rep local_170;
  int local_164;
  duration<long,_std::ratio<1L,_1000000000L>_> local_160;
  base local_158;
  duration local_150;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_148;
  int64_t local_140;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_138;
  duration<long,_std::ratio<1L,_1000000000L>_> local_130;
  Duration next_interval;
  Aggregate local_118;
  duration local_e8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_e0;
  Aggregate local_d8;
  Metric *local_a8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_a0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_98;
  Metric *local_90;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_88;
  TimePoint next_end;
  int local_74;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  base local_68;
  duration local_60;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_58;
  TimePoint next_begin;
  Duration interval;
  type expected_active_time;
  pair<hta::Clock::time_point,_hta::Clock::time_point> r;
  Metric *this_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  this_local = (Metric *)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  end_local = begin;
  check_read(this);
  bVar1 = std::chrono::operator>=
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&this_local);
  if (bVar1) {
    r.second.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           this_local;
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("invalid request: begin timestamp ",
               (time_point)
               end_local.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",(time_point)this_local);
  }
  _expected_active_time = range(this);
  bVar1 = std::chrono::operator<=
                    ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local,
                     (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&expected_active_time);
  if ((bVar1) ||
     (bVar1 = std::chrono::operator>
                        (&end_local.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&r), bVar1)) {
    memset(__return_storage_ptr__,0,0x30);
    Aggregate::Aggregate(__return_storage_ptr__);
  }
  else {
    ptVar2 = std::clamp<hta::Clock::time_point>
                       (&end_local,(time_point *)&expected_active_time,&r.first);
    end_local.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           (ptVar2->
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           .__d.__r;
    ptVar2 = std::clamp<hta::Clock::time_point>
                       ((time_point *)&this_local,(time_point *)&expected_active_time,&r.first);
    this_local = (Metric *)
                 (ptVar2->
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ).__d.__r;
    interval.__r = (rep)std::chrono::operator-
                                  ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&this_local,
                                   &end_local.
                                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  );
    next_begin.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           (this->interval_min_).__r;
    local_74 = 1;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_70,&local_74);
    local_68.__d.__r =
         (duration)
         std::chrono::operator-
                   (&end_local.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ,&local_70);
    Clock::time_point::time_point((time_point *)&local_60,&local_68);
    next_end = next_begin;
    local_58.__d.__r =
         (duration)
         interval_end((TimePoint)local_60.__r,
                      (Duration)
                      next_begin.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r);
    local_90 = this_local;
    local_98.__d.__r =
         (duration)
         (duration)
         next_begin.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_88.__d.__r =
         (duration)
         interval_begin((TimePoint)this_local,
                        (Duration)
                        next_begin.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r);
    bVar1 = std::chrono::operator>=(&local_58,&local_88);
    if (bVar1) {
      local_a0.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      local_a8 = this_local;
      aggregate_raw(__return_storage_ptr__,this,end_local,(TimePoint)this_local);
    }
    else {
      Aggregate::Aggregate(__return_storage_ptr__);
      bVar1 = std::chrono::operator<=
                        (&end_local.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         ,&local_58);
      if (!bVar1) {
        __assert_fail("begin <= next_begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0xc3,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
      local_e0.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      local_e8 = local_58.__d.__r;
      aggregate_raw(&local_d8,this,end_local,(TimePoint)local_58.__d.__r);
      other.maximum = local_d8.maximum;
      other.minimum = local_d8.minimum;
      other.sum = local_d8.sum;
      other.count = local_d8.count;
      other.integral = local_d8.integral;
      other.active_time.__r = local_d8.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other);
      end_local.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_58.__d.__r;
      bVar1 = std::chrono::operator<=
                        (&local_88,
                         (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&this_local);
      if (!bVar1) {
        __assert_fail("next_end <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,199,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
      next_interval.__r = (rep)this_local;
      aggregate_raw(&local_118,this,(TimePoint)local_88.__d.__r,(TimePoint)this_local);
      other_00.maximum = local_118.maximum;
      other_00.minimum = local_118.minimum;
      other_00.sum = local_118.sum;
      other_00.count = local_118.count;
      other_00.integral = local_118.integral;
      other_00.active_time.__r = local_118.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
      while( true ) {
        local_138.__d.__r =
             (duration)
             (duration)
             next_begin.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        local_140 = (this->interval_factor_).factor_;
        this_local = (Metric *)local_88.__d.__r;
        local_130.__r =
             (rep)hta::operator*((Duration)
                                 next_begin.
                                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 .__d.__r,(IntervalFactor)local_140);
        local_164 = 1;
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000000000l>> *)&local_160,&local_164);
        local_158.__d.__r =
             (duration)
             std::chrono::operator-
                       (&end_local.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ,&local_160);
        Clock::time_point::time_point((time_point *)&local_150,&local_158);
        local_170 = local_130.__r;
        local_148.__d.__r = (duration)interval_end((TimePoint)local_150.__r,(Duration)local_130.__r)
        ;
        local_58.__d.__r = local_148.__d.__r;
        bVar1 = std::chrono::operator<=
                          (&end_local.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           ,&local_58);
        if (!bVar1) {
          __assert_fail("begin <= next_begin",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0xcf,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
        }
        local_180 = this_local;
        local_188 = local_130.__r;
        local_178.__d.__r = (duration)interval_begin((TimePoint)this_local,(Duration)local_130.__r);
        local_88.__d.__r = local_178.__d.__r;
        bVar1 = std::chrono::operator<=
                          (&local_88,
                           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&this_local);
        if (!bVar1) {
          __assert_fail("next_end <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0xd1,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
        }
        bVar1 = std::chrono::operator>(&local_130,&this->interval_max_);
        if ((bVar1) || (bVar1 = std::chrono::operator>=(&local_58,&local_88), bVar1)) break;
        local_208.__d.__r =
             (duration)
             (duration)
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        local_210 = local_58.__d.__r;
        local_218.__d.__r =
             (duration)
             (duration)
             next_begin.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        aggregate_interval(&local_200,this,end_local,(TimePoint)local_58.__d.__r,
                           (Duration)
                           next_begin.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r);
        other_02.maximum = local_200.maximum;
        other_02.minimum = local_200.minimum;
        other_02.sum = local_200.sum;
        other_02.count = local_200.count;
        other_02.integral = local_200.integral;
        other_02.active_time.__r = local_200.active_time.__r;
        Aggregate::operator+=(__return_storage_ptr__,other_02);
        end_local.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               local_58.__d.__r;
        aggregate_interval(&local_248,this,(TimePoint)local_88.__d.__r,(TimePoint)this_local,
                           (Duration)
                           next_begin.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r);
        other_03.maximum = local_248.maximum;
        other_03.minimum = local_248.minimum;
        other_03.sum = local_248.sum;
        other_03.count = local_248.count;
        other_03.integral = local_248.integral;
        other_03.active_time.__r = local_248.active_time.__r;
        Aggregate::operator+=(__return_storage_ptr__,other_03);
        next_begin.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               local_130.__r;
      }
      local_1c0.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      local_1c8 = this_local;
      local_1d0.__d.__r =
           (duration)
           (duration)
           next_begin.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      aggregate_interval(&local_1b8,this,end_local,(TimePoint)this_local,
                         (Duration)
                         next_begin.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r);
      other_01.maximum = local_1b8.maximum;
      other_01.minimum = local_1b8.minimum;
      other_01.sum = local_1b8.sum;
      other_01.count = local_1b8.count;
      other_01.integral = local_1b8.integral;
      other_01.active_time.__r = local_1b8.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_01);
      bVar1 = std::chrono::operator==
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         &__return_storage_ptr__->active_time,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)&interval);
      if (!bVar1) {
        __assert_fail("a.active_time == expected_active_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0xe5,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Aggregate Metric::aggregate(hta::TimePoint begin, hta::TimePoint end)
{
    check_read();
    if (begin >= end)
    {
        throw_exception("invalid request: begin timestamp ", begin, " larger than end timestamp ",
                        end);
    }
    // We must cap the end or we use intervals that are not yet completely written
    auto r = range();

    if (end <= r.first || begin > r.second)
    {
        // Really, nothing to see here if the first point isn't even in the interval
        return {};
    }

    // TODO We could further optimize requests from (before) the beginning of time by using the
    // incomplete intervals of upper levels rather than piecing together raw/low ones
    begin = std::clamp(begin, r.first, r.second);
    // We never consider anything after the last point in the data
    end = std::clamp(end, r.first, r.second);
    [[maybe_unused]] const auto expected_active_time = end - begin;

    auto interval = interval_min_;
    auto next_begin = interval_end(begin - Duration(1), interval);
    auto next_end = interval_begin(end, interval);

    if (next_begin >= next_end)
    {
        // No need to go to any intervals or do any splits, just one raw chunk
        return aggregate_raw(begin, end);
    }

    Aggregate a;
    assert(begin <= next_begin);
    a += aggregate_raw(begin, next_begin);
    begin = next_begin;

    assert(next_end <= end);
    a += aggregate_raw(next_end, end);
    end = next_end;

    while (true)
    {
        auto next_interval = interval * interval_factor_;
        next_begin = interval_end(begin - Duration(1), next_interval);
        assert(begin <= next_begin);
        next_end = interval_begin(end, next_interval);
        assert(next_end <= end);

        if (next_interval > interval_max_ || next_begin >= next_end)
        {
            // Finally use the contiguous block
            a += aggregate_interval(begin, end, interval);
            break;
        }

        // add left aggregates
        a += aggregate_interval(begin, next_begin, interval);
        begin = next_begin;

        // add right aggregates
        a += aggregate_interval(next_end, end, interval);
        end = next_end;

        interval = next_interval;
    }

    assert(a.active_time == expected_active_time);
    return a;
}